

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O0

int32_t uldn_regionDisplayName_63
                  (ULocaleDisplayNames *ldn,char *region,UChar *result,int32_t maxResultSize,
                  UErrorCode *pErrorCode)

{
  UBool UVar1;
  Char16Ptr local_90 [3];
  undefined1 local_78 [8];
  UnicodeString temp;
  UErrorCode *pErrorCode_local;
  int32_t maxResultSize_local;
  UChar *result_local;
  char *region_local;
  ULocaleDisplayNames *ldn_local;
  
  temp.fUnion._48_8_ = pErrorCode;
  UVar1 = U_FAILURE(*pErrorCode);
  if (UVar1 == '\0') {
    if ((((ldn == (ULocaleDisplayNames *)0x0) || (region == (char *)0x0)) ||
        ((result == (UChar *)0x0 && (0 < maxResultSize)))) || (maxResultSize < 0)) {
      *(undefined4 *)temp.fUnion._48_8_ = 1;
      ldn_local._4_4_ = 0;
    }
    else {
      icu_63::UnicodeString::UnicodeString((UnicodeString *)local_78,result,0,maxResultSize);
      (**(code **)(*(long *)ldn + 0x58))(ldn,region,(UnicodeString *)local_78);
      icu_63::Char16Ptr::Char16Ptr(local_90,result);
      ldn_local._4_4_ =
           icu_63::UnicodeString::extract
                     ((UnicodeString *)local_78,local_90,maxResultSize,
                      (UErrorCode *)temp.fUnion._48_8_);
      icu_63::Char16Ptr::~Char16Ptr(local_90);
      icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_78);
    }
  }
  else {
    ldn_local._4_4_ = 0;
  }
  return ldn_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uldn_regionDisplayName(const ULocaleDisplayNames *ldn,
                       const char *region,
                       UChar *result,
                       int32_t maxResultSize,
                       UErrorCode *pErrorCode) {
  if (U_FAILURE(*pErrorCode)) {
    return 0;
  }
  if (ldn == NULL || region == NULL || (result == NULL && maxResultSize > 0) || maxResultSize < 0) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return 0;
  }
  UnicodeString temp(result, 0, maxResultSize);
  ((const LocaleDisplayNames *)ldn)->regionDisplayName(region, temp);
  return temp.extract(result, maxResultSize, *pErrorCode);
}